

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThermoIntegrationForceModifier.cpp
# Opt level: O0

void __thiscall
OpenMD::ThermoIntegrationForceModifier::modifyForces(ThermoIntegrationForceModifier *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  RestraintForceModifier *in_RDI;
  RealType rp_00;
  RealType RVar2;
  double pe;
  RealType restPot;
  RealType scaledRestPot;
  RealType rp;
  RealType rawPot;
  Mat3x3d tempTau;
  Vector3d trq;
  Vector3d frc;
  StuntDouble *sd;
  IntegrableObjectIterator ii;
  Molecule *mol;
  MoleculeIterator mi;
  Snapshot *curSnapshot;
  RealType in_stack_000002f8;
  RestraintForceModifier *in_stack_00000300;
  Snapshot *in_stack_fffffffffffffe38;
  Snapshot *in_stack_fffffffffffffe40;
  StuntDouble *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  iterator *in_stack_fffffffffffffe58;
  SimInfo *in_stack_fffffffffffffe60;
  double local_150;
  double local_148;
  StuntDouble *local_30;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_28;
  Molecule *local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  Snapshot *local_10;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_28);
  Vector3<double>::Vector3((Vector3<double> *)0x37db78);
  Vector3<double>::Vector3((Vector3<double> *)0x37db85);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x37db92);
  local_20 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffe60,(MoleculeIterator *)in_stack_fffffffffffffe58);
  while (local_20 != (Molecule *)0x0) {
    local_30 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    while (local_30 != (StuntDouble *)0x0) {
      StuntDouble::getFrc(in_stack_fffffffffffffe48);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe40,
                 (Vector3<double> *)in_stack_fffffffffffffe38);
      Vector<double,_3U>::operator*=
                ((Vector<double,_3U> *)in_stack_fffffffffffffe40,(double)in_stack_fffffffffffffe38);
      StuntDouble::setFrc((StuntDouble *)
                          CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                          (Vector3d *)in_stack_fffffffffffffe48);
      bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffe40);
      if (bVar1) {
        StuntDouble::getTrq(in_stack_fffffffffffffe48);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffe40,
                   (Vector3<double> *)in_stack_fffffffffffffe38);
        Vector<double,_3U>::operator*=
                  ((Vector<double,_3U> *)in_stack_fffffffffffffe40,(double)in_stack_fffffffffffffe38
                  );
        StuntDouble::setTrq((StuntDouble *)
                            CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                            (Vector3d *)in_stack_fffffffffffffe48);
      }
      local_30 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    local_20 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffe60,(MoleculeIterator *)in_stack_fffffffffffffe58);
  }
  this_00 = SimInfo::getSnapshotManager((in_RDI->super_ForceModifier).info_);
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  rp_00 = Snapshot::getPotentialEnergy(in_stack_fffffffffffffe40);
  Snapshot::setRawPotential(local_10,rp_00);
  RVar2 = Snapshot::getRestraintPotential(local_10);
  pe = rp_00 * (double)in_RDI[1].restraints_.
                       super__Vector_base<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  Snapshot::setPotentialEnergy(local_10,pe);
  Snapshot::getVirialTensor(in_stack_fffffffffffffe38);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_stack_fffffffffffffe40,
             (SquareMatrix3<double> *)in_stack_fffffffffffffe38);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x37de64);
  RectMatrix<double,_3U,_3U>::operator*=
            ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffe40,
             (double)in_stack_fffffffffffffe38);
  Snapshot::setVirialTensor(in_stack_fffffffffffffe40,(Mat3x3d *)in_stack_fffffffffffffe38);
  local_148 = 0.0;
  local_150 = 0.0;
  bVar1 = Globals::getUseRestraints((Globals *)0x37debd);
  if (bVar1) {
    local_148 = RestraintForceModifier::doRestraints(in_stack_00000300,in_stack_000002f8);
    local_150 = RestraintForceModifier::getUnscaledPotential(in_RDI);
  }
  Snapshot::setPotentialEnergy(local_10,pe + local_148);
  Snapshot::setRestraintPotential(local_10,RVar2 + local_150);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x37df99);
  return;
}

Assistant:

void ThermoIntegrationForceModifier::modifyForces() {
    Snapshot* curSnapshot;
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;
    Vector3d frc;
    Vector3d trq;
    Mat3x3d tempTau;

    // now scale forces and torques of all the sds
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        frc = sd->getFrc();
        frc *= factor_;
        sd->setFrc(frc);

        if (sd->isDirectional()) {
          trq = sd->getTrq();
          trq *= factor_;
          sd->setTrq(trq);
        }
      }
    }

    curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // set rawPotential to be the unscaled potential energy
    RealType rawPot = curSnapshot->getPotentialEnergy();
    curSnapshot->setRawPotential(rawPot);

    RealType rp = curSnapshot->getRestraintPotential();

    // scale the potential and update the snapshot
    rawPot *= factor_;
    curSnapshot->setPotentialEnergy(rawPot);

    // scale the virial tensor
    tempTau = curSnapshot->getVirialTensor();
    tempTau *= factor_;
    curSnapshot->setVirialTensor(tempTau);

    // now, on to the applied restraining potentials (if needed):
    RealType scaledRestPot(0.0);
    RealType restPot(0.0);

    if (simParam_->getUseRestraints()) {
      // do restraints from RestraintForceModifier:
      scaledRestPot = doRestraints(1.0 - factor_);
      restPot       = getUnscaledPotential();
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &scaledRestPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // give the final values to the snapshot
    curSnapshot->setPotentialEnergy(rawPot + scaledRestPot);
    curSnapshot->setRestraintPotential(rp + restPot);
  }